

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int SetFilPos(GmfMshSct *msh,int64_t pos)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  
  iVar1 = fseek(*(FILE **)(in_RDI + 0x300410),in_RSI,0);
  return (int)(iVar1 == 0);
}

Assistant:

static int SetFilPos(GmfMshSct *msh, int64_t pos)
{
#ifdef WITH_GMF_AIO
   if(msh->typ & Bin)
      return((lseek(msh->FilDes, (size_t)pos, 0) != -1));
   else
      return((MYFSEEK(msh->hdl, (size_t)pos, SEEK_SET) == 0));
#else
   return((MYFSEEK(msh->hdl, (size_t)pos, SEEK_SET) == 0));
#endif
}